

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O0

void __thiscall
capnp::_::StructBuilder::setDataField<bool>(StructBuilder *this,StructDataOffset offset,bool value)

{
  uint uVar1;
  byte *pbVar2;
  uint bitnum;
  byte *b;
  uint boffset;
  bool value_local;
  StructDataOffset offset_local;
  StructBuilder *this_local;
  
  pbVar2 = (byte *)((long)this->data + (ulong)(offset >> 3));
  uVar1 = unboundMaxBits<3u,unsigned_int>(offset & 7);
  *pbVar2 = *pbVar2 & ((byte)(1 << ((byte)uVar1 & 0x1f)) ^ 0xff) | value << ((byte)uVar1 & 0x1f);
  return;
}

Assistant:

inline void StructBuilder::setDataField<bool>(StructDataOffset offset, bool value) {
  auto boffset = offset * (ONE * BITS / ELEMENTS);
  byte* b = reinterpret_cast<byte*>(data) + boffset / BITS_PER_BYTE;
  uint bitnum = unboundMaxBits<3>(boffset % BITS_PER_BYTE / BITS);
  *reinterpret_cast<uint8_t*>(b) = (*reinterpret_cast<uint8_t*>(b) & ~(1 << bitnum))
                                 | (static_cast<uint8_t>(value) << bitnum);
}